

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O2

void webrtc::WindowGenerator::KaiserBesselDerived(float alpha,size_t length,float *window)

{
  undefined1 auVar1 [12];
  string *result;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar7 [16];
  float extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  size_t length_local;
  complex<float> r;
  complex<float> local_1d8;
  complex<float> local_1d0;
  float local_1c8 [2];
  float local_1c0 [2];
  float local_1b8 [2];
  float local_1b0 [2];
  complex<float> y;
  
  y._M_value._0_4_ = 1;
  length_local = length;
  result = rtc::CheckGTImpl<unsigned_long,unsigned_int>(&length_local,(uint *)&y,"length > 1U");
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&y,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x33,result);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&y);
  }
  if (window != (float *)0x0) {
    fVar6 = alpha * 3.1415927;
    uVar5 = length_local + 1 >> 1;
    fVar10 = 0.0;
    for (lVar3 = 0; uVar5 + 1 != lVar3; lVar3 = lVar3 + 1) {
      r._M_value._0_4_ = ((float)lVar3 * 4.0) / (float)length_local + -1.0;
      r._M_value._4_4_ = 0;
      std::operator*(&r,&r);
      auVar1._4_8_ = extraout_XMM0._8_8_;
      auVar1._0_4_ = extraout_XMM0._4_4_ ^ 0x80000000;
      auVar9._0_8_ = auVar1._0_8_ << 0x20;
      auVar9._8_4_ = extraout_XMM0._8_4_ ^ 0x80000000;
      auVar9._12_4_ = extraout_XMM0._12_4_ ^ 0x80000000;
      auVar7._4_12_ = auVar9._4_12_;
      auVar7._0_4_ = 1.0 - extraout_XMM0._0_4_;
      local_1d8._M_value = auVar7._0_8_;
      std::sqrt<float>(&local_1d8);
      auVar8._0_4_ = extraout_XMM0_Da * fVar6;
      auVar8._4_4_ = extraout_XMM0_Db * fVar6;
      auVar8._8_4_ = extraout_XMM0_Dc * fVar6;
      auVar8._12_4_ = extraout_XMM0_Dd * fVar6;
      auVar9 = divps(auVar8,_DAT_0019d2a0);
      y._M_value = auVar9._0_8_;
      std::complex<float>::operator*=(&y,&y);
      local_1d0._M_value =
           CONCAT44((float)(y._M_value >> 0x20) * 0.0045813,
                    (float)y._M_value * 0.0045813 + 0.0360768);
      std::operator*(&y,&local_1d0);
      local_1c8[0] = extraout_XMM0_Da_00 + 0.2659732;
      std::operator*(&y,(complex<float> *)local_1c8);
      local_1c0[0] = extraout_XMM0_Da_01 + 1.2067492;
      std::operator*(&y,(complex<float> *)local_1c0);
      local_1b8[0] = extraout_XMM0_Da_02 + 3.0899425;
      std::operator*(&y,(complex<float> *)local_1b8);
      local_1b0[0] = extraout_XMM0_Da_03 + 3.5156229;
      std::operator*(&y,(complex<float> *)local_1b0);
      fVar10 = fVar10 + extraout_XMM0_Da_04 + 1.0;
      window[lVar3] = fVar10;
    }
    lVar3 = -length_local;
    uVar4 = length_local;
    while (uVar4 = uVar4 - 1, uVar5 <= uVar4) {
      fVar6 = window[length_local + lVar3] / fVar10;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      window[lVar3 + length_local] = fVar6;
      window[uVar4] = fVar6;
      lVar3 = lVar3 + 1;
    }
    if ((length_local & 1) != 0) {
      fVar10 = window[uVar5 - 1] / fVar10;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      window[uVar5 - 1] = fVar10;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            ((FatalMessage *)&y,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x34);
  poVar2 = std::operator<<((ostream *)&y,"Check failed: window != nullptr");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"# ");
  rtc::FatalMessage::~FatalMessage((FatalMessage *)&y);
}

Assistant:

void WindowGenerator::KaiserBesselDerived(float alpha, size_t length,
                                          float* window) {
  RTC_CHECK_GT(length, 1U);
  RTC_CHECK(window != nullptr);

  const size_t half = (length + 1) / 2;
  float sum = 0.0f;

  for (size_t i = 0; i <= half; ++i) {
    complex<float> r = (4.0f * i) / length - 1.0f;
    sum += I0(static_cast<float>(M_PI) * alpha * sqrt(1.0f - r * r)).real();
    window[i] = sum;
  }
  for (size_t i = length - 1; i >= half; --i) {
    window[length - i - 1] = sqrtf(window[length - i - 1] / sum);
    window[i] = window[length - i - 1];
  }
  if (length % 2 == 1) {
    window[half - 1] = sqrtf(window[half - 1] / sum);
  }
}